

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anandan.c
# Opt level: O2

void insert_node(qnode_ptr_t p,qnode_ptr_t *h,qnode_ptr_t *q)

{
  qnode_ptr_t ptVar1;
  qnode_ptr_t ptVar2;
  t_qnode **pptVar3;
  t_qnode **pptVar4;
  
  ptVar2 = (qnode_ptr_t)0x0;
  pptVar4 = h;
  while ((ptVar1 = *pptVar4, ptVar1 != (qnode_ptr_t)0x0 && (p->level < ptVar1->level))) {
    ptVar2 = ptVar1;
    pptVar4 = &ptVar1->forth;
  }
  pptVar4 = &ptVar2->forth;
  if (ptVar2 == (qnode_ptr_t)0x0) {
    pptVar4 = h;
  }
  pptVar3 = &ptVar1->back;
  if (ptVar1 == (qnode_ptr_t)0x0) {
    pptVar3 = q;
  }
  *pptVar4 = p;
  *pptVar3 = p;
  p->back = ptVar2;
  p->forth = ptVar1;
  return;
}

Assistant:

void insert_node(p,h,q)
qnode_ptr_t p, *h, *q ;

{ qnode_ptr_t s, t ;

  t = *h ;
  s = (qnode_ptr_t)NULL ;
  while ((t != (qnode_ptr_t)NULL) && (p->level < t->level)) {
    s = t ;
    t = t->forth ;
  }
  if (s != (qnode_ptr_t)NULL) {
    s->forth = p ;
  }
  else {
    *h = p ;
  }
  if (t != (qnode_ptr_t)NULL) {
    t->back = p ;
  }
  else {
    *q = p ;
  }
  p->back = s ;
  p->forth = t ;
}